

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::Pass::GetNullId(Pass *this,uint32_t type_id)

{
  bool bVar1;
  uint32_t uVar2;
  TypeManager *this_00;
  ConstantManager *this_01;
  Type *type;
  Constant *c;
  Instruction *this_02;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  bVar1 = IsFloat(this,type_id,0x10);
  if (bVar1) {
    IRContext::AddCapability(this->context_,CapabilityFloat16);
  }
  this_00 = IRContext::get_type_mgr(this->context_);
  this_01 = IRContext::get_constant_mgr(this->context_);
  type = analysis::TypeManager::GetType(this_00,type_id);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c = analysis::ConstantManager::GetConstant
                (this_01,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  this_02 = analysis::ConstantManager::GetDefiningInstruction
                      (this_01,c,type_id,(inst_iterator *)0x0);
  uVar2 = Instruction::result_id(this_02);
  return uVar2;
}

Assistant:

uint32_t Pass::GetNullId(uint32_t type_id) {
  if (IsFloat(type_id, 16)) context()->AddCapability(spv::Capability::Float16);
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  const analysis::Type* type = type_mgr->GetType(type_id);
  const analysis::Constant* null_const = const_mgr->GetConstant(type, {});
  Instruction* null_inst =
      const_mgr->GetDefiningInstruction(null_const, type_id);
  return null_inst->result_id();
}